

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

bool IsVirtualFunctionCall(ExpressionContext *ctx,FunctionData *function,TypeBase *type)

{
  byte in_AL;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  TypeClass *classType;
  InplaceStr IVar5;
  
  if (function != (FunctionData *)0x0) {
    if (ctx->typeAutoRef == (TypeStruct *)type) {
      bVar1 = true;
    }
    else {
      if ((type == (TypeBase *)0x0) || (type->typeID != 0x12)) {
        type = (TypeBase *)0x0;
      }
      if (type == (TypeBase *)0x0) {
        bVar1 = false;
      }
      else {
        classType = (TypeClass *)type[1]._vptr_TypeBase;
        if ((classType == (TypeClass *)0x0) ||
           ((classType->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
          classType = (TypeClass *)0x0;
        }
        if ((classType == (TypeClass *)0x0) ||
           ((classType->extendable == false && (classType->baseClass == (TypeClass *)0x0)))) {
          bVar4 = 0;
        }
        else {
          uVar2 = NULLC::StringHashContinue
                            ((classType->super_TypeStruct).super_TypeBase.nameHash,"::");
          IVar5 = GetTypeConstructorName(classType);
          uVar3 = NULLC::StringHashContinue(uVar2,IVar5.begin,IVar5.end);
          uVar2 = function->nameHash;
          bVar4 = 1;
          if (uVar2 == uVar3) {
            in_AL = 0;
          }
          else {
            uVar3 = NULLC::StringHashContinue(uVar3,"$");
            in_AL = uVar2 != uVar3;
          }
        }
        bVar1 = (bool)(in_AL & bVar4);
      }
    }
    return bVar1;
  }
  __assert_fail("function",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x19ba,
                "bool IsVirtualFunctionCall(ExpressionContext &, FunctionData *, TypeBase *)");
}

Assistant:

bool IsVirtualFunctionCall(ExpressionContext &ctx, FunctionData *function, TypeBase *type)
{
	assert(function);

	if(type == ctx.typeAutoRef)
		return true;

	if(TypeRef *refType = getType<TypeRef>(type))
	{
		if(TypeClass *classType = getType<TypeClass>(refType->subType))
		{
			if(classType->extendable || classType->baseClass != NULL)
			{
				unsigned hash = NULLC::StringHashContinue(classType->nameHash, "::");

				InplaceStr constructor = GetTypeConstructorName(classType);

				hash = NULLC::StringHashContinue(hash, constructor.begin, constructor.end);

				if(function->nameHash == hash || function->nameHash == NULLC::StringHashContinue(hash, "$"))
					return false;

				return true;
			}
		}
	}

	return false;
}